

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

Node * PruneSection(TidyDocImpl *doc,Node *node)

{
  Lexer *lexer;
  Node **ppNVar1;
  int iVar2;
  Node *check;
  Node *pNVar3;
  long lVar4;
  
  lexer = doc->lexer;
  iVar2 = prvTidytmbstrncmp(lexer->lexbuf + node->start,"if !supportEmptyParas",0x15);
  if ((node != (Node *)0x0) && (pNVar3 = node, iVar2 == 0)) {
    do {
      if ((pNVar3->tag != (Dict *)0x0) && (pNVar3->tag->id == TidyTag_TD)) {
        pNVar3 = prvTidyNewLiteralTextNode(lexer,anon_var_dwarf_355c8);
        prvTidyInsertNodeBeforeElement(node,pNVar3);
        break;
      }
      ppNVar1 = &pNVar3->parent;
      pNVar3 = *ppNVar1;
    } while (*ppNVar1 != (Node *)0x0);
  }
  if (node->type == TextNode) {
    pNVar3 = node->next;
  }
  else {
    pNVar3 = prvTidyDiscardElement(doc,node);
  }
  if (pNVar3 == (Node *)0x0) {
    lVar4 = 1;
  }
  else {
    lVar4 = 0;
    if (pNVar3->type == SectionTag) {
      iVar2 = prvTidytmbstrncmp(lexer->lexbuf + pNVar3->start,"if",2);
      if (iVar2 == 0) {
        PruneSection(doc,pNVar3);
        pNVar3 = (Node *)(*(code *)0x137345)();
        return pNVar3;
      }
      iVar2 = prvTidytmbstrncmp(lexer->lexbuf + pNVar3->start,"endif",5);
      if (iVar2 == 0) {
        prvTidyDiscardElement(doc,pNVar3);
        lVar4 = 2;
      }
    }
  }
  pNVar3 = (Node *)(*(code *)((long)&DAT_00150cdc + (long)(int)(&DAT_00150cdc)[lVar4]))();
  return pNVar3;
}

Assistant:

static Node* PruneSection( TidyDocImpl* doc, Node *node )
{
    Lexer* lexer = doc->lexer;

    for (;;)
    {
        ctmbstr lexbuf = lexer->lexbuf + node->start;
        if ( TY_(tmbstrncmp)(lexbuf, "if !supportEmptyParas", 21) == 0 )
        {
          Node* cell = FindEnclosingCell( doc, node );
          if ( cell )
          {
            /* Need to put &nbsp; into cell so it doesn't look weird
            */
            Node* nbsp = TY_(NewLiteralTextNode)( lexer, "\240" );
            assert( (byte)'\240' == (byte)160 );
            TY_(InsertNodeBeforeElement)( node, nbsp );
          }
        }

        /* discard node and returns next, unless it is a text node */
        if ( node->type == TextNode )
            node = node->next;
        else
            node = TY_(DiscardElement)( doc, node );

        if (node == NULL)
            return NULL;
        
        if (node->type == SectionTag)
        {
            if (TY_(tmbstrncmp)(lexer->lexbuf + node->start, "if", 2) == 0)
            {
                node = PruneSection( doc, node );
                continue;
            }

            if (TY_(tmbstrncmp)(lexer->lexbuf + node->start, "endif", 5) == 0)
            {
                node = TY_(DiscardElement)( doc, node );
                break;
            }
        }
    }

    return node;
}